

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O3

void __thiscall Num::Num(Num *this,Short length,Byte dig)

{
  (this->base)._M_dataplus._M_p = (pointer)&(this->base).field_2;
  (this->base)._M_string_length = 0;
  (this->base).field_2._M_local_buf[0] = '\0';
  this->size = length;
  std::__cxx11::string::_M_replace_aux((ulong)&this->base,0,0,(char)length);
  return;
}

Assistant:

Num::Num(Num::Short length, Byte dig) // constructor that create a number of a given length consisting of a certain digit
{
    size = length;
    base.append(length, (char) dig + 48);
}